

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O1

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,FnDecl *node)

{
  Identifier *pIVar1;
  BlockStmt *pBVar2;
  pointer puVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"define ",7);
  pIVar1 = (node->m_ident)._M_t.
           super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>._M_t.
           super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>.
           super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl;
  (**(code **)((long)(pIVar1->super_Expr).super_Stmt + 0x10))(pIVar1,this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," with params ",0xd);
  puVar3 = (node->m_params).
           super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar3 != (node->m_params).
                super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pIVar1 = (puVar3->_M_t).
               super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>._M_t.
               super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>.
               super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl;
      (**(code **)((long)(pIVar1->super_Expr).super_Stmt + 0x10))(pIVar1,this);
      puVar3 = puVar3 + 1;
      if (puVar3 != (node->m_params).
                    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      }
    } while (puVar3 != (node->m_params).
                       super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and body ",10);
  pBVar2 = (node->m_body)._M_t.
           super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>._M_t.
           super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
           super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl;
  (*(pBVar2->super_Stmt)._vptr_Stmt[2])(pBVar2,this);
  return;
}

Assistant:

void PrettyPrinter::visit(AST::FnDecl *node) {
    std::cout << "define ";
    node->m_ident->accept(this);
    std::cout << " with params ";
    for (auto iter = node->m_params.cbegin(); iter != node->m_params.cend(); ++iter) {
        iter->get()->accept(this);
        if (iter + 1 != node->m_params.cend()) {
            std::cout << " ";
        }
    }
    std::cout << " and body ";
    node->m_body->accept(this);
    // no need to end, block statement will
}